

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O0

void jessilib::string_byteswap<char32_t>(string *in_string)

{
  bool bVar1;
  size_type sVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  unit_end;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  iterator itr;
  string *in_string_local;
  
  itr._M_current = (char *)in_string;
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (in_string);
  if ((sVar2 & 3) == 0) {
    local_18._M_current =
         (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 begin(itr._M_current);
    while( true ) {
      unit_end._M_current =
           (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   end(itr._M_current);
      bVar1 = __gnu_cxx::
              operator==<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        (&local_18,&unit_end);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      __last = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator+(&local_18,4);
      std::reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(local_18,__last);
      local_18 = __last;
    }
  }
  return;
}

Assistant:

void string_byteswap(std::string& in_string) {
	// Ensure correct number of bytes for underlying representation type
	if (in_string.size() % sizeof(CharT) != 0) {
		return;
	}

	for (auto itr = in_string.begin(); itr != in_string.end();) {
		auto unit_end = itr + sizeof(CharT);
		std::reverse(itr, unit_end);
		itr = unit_end;
	}
}